

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax
          (ModuleHeaderSyntax *this,SyntaxKind kind,Token moduleKeyword,Token lifetime,Token name,
          SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *imports,
          ParameterPortListSyntax *parameters,PortListSyntax *ports,Token semi)

{
  bool bVar1;
  reference ppPVar2;
  SyntaxNode *in_RCX;
  undefined8 in_RDX;
  SyntaxKind in_ESI;
  SyntaxNode *in_RDI;
  SyntaxNode *in_R8;
  undefined8 in_R9;
  PackageImportDeclarationSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *__range2;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *this_00;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *this_01;
  __normal_iterator<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxNode *local_38;
  SyntaxNode *local_20;
  undefined8 local_18;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_01 = (SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)&__range2;
  this_00 = (SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)&stack0x00000008;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  SyntaxNode::SyntaxNode(in_RDI,in_ESI);
  *(undefined8 *)(in_RDI + 1) = local_10;
  in_RDI[1].parent = local_8;
  in_RDI[1].previewNode = local_20;
  *(undefined8 *)(in_RDI + 2) = local_18;
  in_RDI[2].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax>::SyntaxList(this_01,this_00);
  in_RDI[5].parent = (SyntaxNode *)__end2._M_current;
  in_RDI[5].previewNode = (SyntaxNode *)__begin2._M_current;
  *(_func_int ***)(in_RDI + 6) = (this_01->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[6].parent = *(SyntaxNode **)&(this_01->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[3].previewNode = in_RDI;
  local_38 = in_RDI + 3;
  local_40._M_current =
       (PackageImportDeclarationSyntax **)
       std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> *)
                  this_00);
  std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> *)in_RDI
            );
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_40);
    ((*ppPVar2)->super_MemberSyntax).super_SyntaxNode.parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::PackageImportDeclarationSyntax_**,_std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  if (in_RDI[5].parent != (SyntaxNode *)0x0) {
    (in_RDI[5].parent)->parent = in_RDI;
  }
  if (in_RDI[5].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[5].previewNode)->parent = in_RDI;
  }
  return;
}

Assistant:

ModuleHeaderSyntax(SyntaxKind kind, Token moduleKeyword, Token lifetime, Token name, const SyntaxList<PackageImportDeclarationSyntax>& imports, ParameterPortListSyntax* parameters, PortListSyntax* ports, Token semi) :
        SyntaxNode(kind), moduleKeyword(moduleKeyword), lifetime(lifetime), name(name), imports(imports), parameters(parameters), ports(ports), semi(semi) {
        this->imports.parent = this;
        for (auto child : this->imports)
            child->parent = this;
        if (this->parameters) this->parameters->parent = this;
        if (this->ports) this->ports->parent = this;
    }